

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int shallow_dump(nvamemtiming_conf *conf)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  value_type vVar4;
  byte bVar5;
  int iVar6;
  FILE *__stream;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  char filename [21];
  
  bVar5 = (conf->field_4).manual.index;
  bVar1 = (conf->field_4).manual.value;
  uVar8 = (ulong)bVar1;
  if ((bVar5 == 0xff) || (uVar8 = 0xff, bVar1 == 0xff)) {
    sprintf(filename,"regs_timing_%i_%i",(ulong)bVar5,uVar8);
  }
  else {
    builtin_strncpy(filename,"regs_timing",0xc);
  }
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open regs_timing");
    iVar6 = 1;
  }
  else {
    timing_value_types = nv40_timing_value_types;
    if (0xbf < (nva_cards[conf->cnum]->chipset).card_type) {
      timing_value_types = nvc0_timing_value_types;
    }
    bVar5 = (conf->field_4).manual.index;
    if (bVar5 == 0xff) {
      (conf->field_4).manual.index = '\0';
      bVar5 = 0;
    }
    if ((conf->field_4).manual.value == 0xff) {
      (conf->field_4).manual.value = (char)(conf->vbios).timing_entry_length + 0xff;
    }
    fprintf(_stderr,"Shallow mode: Will iterate between %i and %i\n",(ulong)bVar5);
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    for (uVar8 = (ulong)(conf->field_4).manual.index; uVar8 <= (conf->field_4).manual.value;
        uVar8 = uVar8 + 1) {
      puVar7 = (conf->vbios).data;
      uVar3 = (conf->vbios).timing_entry_offset;
      uVar9 = (ulong)uVar3;
      uVar2 = puVar7[uVar8 + uVar9];
      vVar4 = timing_value_types[uVar8];
      if (vVar4 == VALUE) {
LAB_0010470b:
        puVar7[uVar9 + uVar8] = puVar7[uVar9 + uVar8] + '\x01';
        launch(conf,(FILE *)__stream,(uint8_t)uVar8 + '\x01',COLOR);
      }
      else {
        if ((vVar4 == EMPTY) && (uVar2 != '\0')) {
          fwrite("WARNING: The following entry was supposed to be unused!\n",0x38,1,__stream);
          puVar7 = (conf->vbios).data;
          uVar9 = (ulong)(conf->vbios).timing_entry_offset;
          goto LAB_0010470b;
        }
        if (vVar4 == BITFIELD) {
          iterate_bitfield(conf,(FILE *)__stream,(uint8_t)uVar8,(uint)uVar3);
        }
        else if (vVar4 == EMPTY) {
          fprintf(__stream,"timing entry [%u/%u] is supposed empty\n\n",(ulong)((int)uVar8 + 1),
                  (ulong)(conf->vbios).timing_entry_length);
        }
      }
      (conf->vbios).data[uVar8 + (conf->vbios).timing_entry_offset] = uVar2;
    }
    fclose(__stream);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
shallow_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == (unsigned char) -1 ||  conf->range.end == (unsigned char) -1)
		sprintf(filename, "regs_timing_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing");
		return 1;
	}

	if (nva_cards[conf->cnum]->chipset.card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length - 1;

	fprintf(stderr, "Shallow mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = conf->range.start; i <= conf->range.end; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			conf->vbios.data[conf->vbios.timing_entry_offset + i]++;
			launch(conf, outf, i + 1, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}